

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtmpfil.cpp
# Opt level: O0

vm_obj_id_t CVmObjTemporaryFile::create_from_stack(uchar **pc_ptr,uint argc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  int in_ESI;
  vm_obj_id_t id;
  char fname [4096];
  undefined4 in_stack_ffffffffffffefd8;
  vm_obj_id_t in_stack_ffffffffffffefdc;
  int in_stack_ffffffffffffefe0;
  int in_stack_ffffffffffffefe4;
  char *in_stack_ffffffffffffefe8;
  
  if (in_ESI != 0) {
    err_throw(0);
  }
  iVar1 = os_gen_temp_filename
                    (in_stack_ffffffffffffefe8,
                     CONCAT44(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0));
  if (iVar1 == 0) {
    err_throw(0);
  }
  vVar2 = vm_new_id(in_stack_ffffffffffffefe4,in_stack_ffffffffffffefe0,in_stack_ffffffffffffefdc);
  CVmObject::operator_new(CONCAT44(vVar2,in_stack_ffffffffffffefe0),in_stack_ffffffffffffefdc);
  CVmObjTemporaryFile((CVmObjTemporaryFile *)CONCAT44(vVar2,in_stack_ffffffffffffefe0),
                      (char *)CONCAT44(in_stack_ffffffffffffefdc,in_stack_ffffffffffffefd8));
  CVmObjTable::set_obj_transient
            ((CVmObjTable *)CONCAT44(vVar2,in_stack_ffffffffffffefe0),in_stack_ffffffffffffefdc);
  return vVar2;
}

Assistant:

vm_obj_id_t CVmObjTemporaryFile::create_from_stack(
    VMG_ const uchar **pc_ptr, uint argc)
{
    /* check arguments */
    if (argc != 0)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* generate a temporary filename in the local file system */
    char fname[OSFNMAX];
    if (!os_gen_temp_filename(fname, sizeof(fname)))
        err_throw(VMERR_CREATE_FILE);

    /* allocate the object ID and create the object */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
    new (vmg_ id) CVmObjTemporaryFile(vmg_ fname);

    /* temporary file objects are always transient */
    G_obj_table->set_obj_transient(id);

    /* return the new ID */
    return id;
}